

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineFiller.cc
# Opt level: O1

vector<long,_std::allocator<long>_> * __thiscall
LineFiller::score_function
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,LineFiller *this,
          sgNodeID_t n1,sgNodeID_t n2,
          vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *paths)

{
  PerfectMatch *pPVar1;
  uint *puVar2;
  int iVar3;
  undefined4 uVar4;
  int32_t iVar5;
  int32_t iVar6;
  undefined6 uVar7;
  iterator iVar8;
  iterator iVar9;
  vector<long,_std::allocator<long>_> *pvVar10;
  uint uVar11;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  long *rid;
  uint *puVar16;
  vector<long,_std::allocator<long>_> *__range2;
  pointer pSVar17;
  pointer __args;
  PerfectMatch *match;
  PerfectMatch *pPVar18;
  uint uVar19;
  long *node;
  int iVar20;
  PerfectMatch *match_1;
  vector<long,_std::allocator<long>_> abs_nodes;
  vector<PerfectMatch,_std::allocator<PerfectMatch>_> shared_matches;
  vector<long,_std::allocator<long>_> shared_reads;
  value_type reads_n2;
  value_type reads_n1;
  vector<long,_std::allocator<long>_> local_e8;
  PerfectMatch *local_c8;
  iterator iStack_c0;
  PerfectMatch *local_b8;
  uint *local_a8;
  iterator iStack_a0;
  long *local_98;
  int local_8c;
  vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_> *local_88;
  ulong local_80;
  vector<long,_std::allocator<long>_> local_78;
  vector<long,_std::allocator<long>_> local_60;
  vector<long,_std::allocator<long>_> *local_48;
  pointer local_40;
  ulong local_38;
  
  uVar13 = (ulong)(uint)-(int)n1;
  if (0 < (int)n1) {
    uVar13 = n1 & 0xffffffff;
  }
  local_88 = paths;
  local_48 = __return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::vector
            (&local_60,
             (vector<long,_std::allocator<long>_> *)
             (uVar13 * 0x18 + *(long *)(*(long *)(this + 8) + 0x48)));
  uVar13 = (ulong)(uint)-(int)n2;
  if (0 < (int)n2) {
    uVar13 = n2 & 0xffffffff;
  }
  std::vector<long,_std::allocator<long>_>::vector
            (&local_78,
             (vector<long,_std::allocator<long>_> *)
             (uVar13 * 0x18 + *(long *)(*(long *)(this + 8) + 0x48)));
  local_a8 = (uint *)0x0;
  iStack_a0._M_current = (long *)0x0;
  local_98 = (long *)0x0;
  if (local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish &&
      local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    __args = local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar16 = (uint *)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start;
    do {
      uVar19 = *puVar16;
      uVar11 = (uint)*__args;
      uVar14 = -uVar11;
      if (0 < (int)uVar11) {
        uVar14 = uVar11;
      }
      uVar11 = -uVar19;
      if (0 < (int)uVar19) {
        uVar11 = uVar19;
      }
      if (uVar14 < uVar11) {
        __args = __args + 1;
      }
      else {
        if (uVar14 <= uVar11) {
          if (iStack_a0._M_current == local_98) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_a8,iStack_a0,__args);
          }
          else {
            *iStack_a0._M_current = *__args;
            iStack_a0._M_current = iStack_a0._M_current + 1;
          }
          __args = __args + 1;
        }
        puVar16 = puVar16 + 2;
      }
    } while ((__args != local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish) &&
            (puVar16 !=
             (uint *)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish));
  }
  iVar9._M_current = iStack_a0._M_current;
  local_c8 = (PerfectMatch *)0x0;
  iStack_c0._M_current = (PerfectMatch *)0x0;
  local_b8 = (PerfectMatch *)0x0;
  if (local_a8 != (uint *)iStack_a0._M_current) {
    puVar16 = local_a8;
    do {
      uVar19 = *puVar16;
      uVar14 = -uVar19;
      if (0 < (int)uVar19) {
        uVar14 = uVar19;
      }
      pPVar1 = *(PerfectMatch **)(*(long *)(*(long *)(this + 8) + 0x18) + 8 + (ulong)uVar14 * 0x18);
      for (pPVar18 = *(PerfectMatch **)
                      (*(long *)(*(long *)(this + 8) + 0x18) + (ulong)uVar14 * 0x18);
          pPVar18 != pPVar1; pPVar18 = pPVar18 + 1) {
        if (iStack_c0._M_current == local_b8) {
          std::vector<PerfectMatch,std::allocator<PerfectMatch>>::
          _M_realloc_insert<PerfectMatch_const&>
                    ((vector<PerfectMatch,std::allocator<PerfectMatch>> *)&local_c8,iStack_c0,
                     pPVar18);
        }
        else {
          uVar7 = *(undefined6 *)&pPVar18->field_0x12;
          (iStack_c0._M_current)->size = pPVar18->size;
          *(undefined6 *)&(iStack_c0._M_current)->field_0x12 = uVar7;
          uVar4 = *(undefined4 *)((long)&pPVar18->node + 4);
          iVar5 = pPVar18->node_position;
          iVar6 = pPVar18->read_position;
          *(int *)&(iStack_c0._M_current)->node = (int)pPVar18->node;
          *(undefined4 *)((long)&(iStack_c0._M_current)->node + 4) = uVar4;
          (iStack_c0._M_current)->node_position = iVar5;
          (iStack_c0._M_current)->read_position = iVar6;
          iStack_c0._M_current = iStack_c0._M_current + 1;
        }
      }
      puVar16 = puVar16 + 2;
    } while (puVar16 != (uint *)iVar9._M_current);
  }
  pSVar17 = (local_88->
            super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_40 = (local_88->
             super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  uVar13 = 0;
  if (pSVar17 != local_40) {
    iVar20 = 0;
    iVar15 = 0;
    do {
      local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (long *)0x0;
      local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (long *)0x0;
      puVar2 = (uint *)(pSVar17->nodes).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish;
      local_8c = iVar20;
      for (puVar16 = (uint *)(pSVar17->nodes).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
          iVar8._M_current = iStack_c0._M_current, puVar16 != puVar2; puVar16 = puVar16 + 2) {
        uVar19 = *puVar16;
        uVar14 = -uVar19;
        if (0 < (int)uVar19) {
          uVar14 = uVar19;
        }
        local_80 = (ulong)uVar14;
        if (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish ==
            local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (&local_e8,
                     (iterator)
                     local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish,(long *)&local_80);
        }
        else {
          *local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_80;
          local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      uVar19 = 0;
      local_38 = uVar13;
      for (pPVar18 = local_c8; pPVar18 != iVar8._M_current; pPVar18 = pPVar18 + 1) {
        iVar20 = (int)pPVar18->node;
        iVar3 = -iVar20;
        if (0 < iVar20) {
          iVar3 = iVar20;
        }
        local_80 = CONCAT44(local_80._4_4_,iVar3);
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_80);
        uVar14 = 0;
        if (_Var12._M_current !=
            local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_finish) {
          uVar14 = (uint)pPVar18->size;
        }
        uVar19 = uVar19 + uVar14;
      }
      iVar20 = local_8c;
      if ((int)local_38 < (int)uVar19) {
        iVar20 = iVar15;
      }
      uVar13 = local_38 & 0xffffffff;
      if ((int)local_38 < (int)uVar19) {
        uVar13 = (ulong)uVar19;
      }
      if (local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      iVar15 = iVar15 + 1;
      pSVar17 = pSVar17 + 1;
    } while (pSVar17 != local_40);
    uVar13 = (ulong)iVar20;
  }
  pvVar10 = local_48;
  std::vector<long,_std::allocator<long>_>::vector
            (local_48,&(local_88->
                       super__Vector_base<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar13].nodes);
  if (local_c8 != (PerfectMatch *)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
  if (local_a8 != (uint *)0x0) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
  }
  if ((uint *)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return pvVar10;
}

Assistant:

std::vector<sgNodeID_t> LineFiller::score_function(sgNodeID_t n1, sgNodeID_t n2, std::vector<SequenceDistanceGraphPath> paths) {

    // Find all reads spanning both nodes

    auto reads_n1 = lrr.node_reads[abs(n1)];
    auto reads_n2 = lrr.node_reads[abs(n2)];
//    std::cout << "Reads in n1: "<< reads_n1.size()<< " reads in n2: "<< reads_n2.size() << std::endl;

    // Get all matches for both ends of the gap
    std::vector<int64_t> shared_reads;
    std::set_intersection(reads_n1.begin(), reads_n1.end(), reads_n2.begin(), reads_n2.end(),  std::back_inserter(shared_reads), [](int64_t r1, int64_t r2){return abs(r1) < abs(r2);});
//    std::cout << "Shared reads: " << shared_reads.size() << std::endl;

    std::vector<PerfectMatch> shared_matches;
    for (const auto& rid: shared_reads){
        for (const auto& match: lrr.read_perfect_matches[abs(rid)]){
            shared_matches.push_back(match);
        }
    }
//    std::cout << "Shared matches: "<< shared_matches.size() << std::endl;

    int32_t max_score = 0;
    int32_t max_score_index = 0;
    int pos = 0;
    for (const auto& path: paths){
        // Absolute node collection for comparison
        int32_t score = 0;
        std::vector<sgNodeID_t> abs_nodes;
        for (const auto& node: path.nodes){
            abs_nodes.push_back(abs(node));
        }

        for (const auto& match: shared_matches){
            if (std::find(abs_nodes.begin(), abs_nodes.end(), abs(match.node)) != abs_nodes.end()){
                score+=match.size;
            }
        }

        if (score>max_score){
            max_score = score;
            max_score_index = pos;
        }

        pos++;
    }
//    std::cout << "Max score: "<< max_score<< " max position: "<< max_score_index << std::endl;
    return paths[max_score_index].nodes;
}